

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O2

void __thiscall QJsonObject::removeImpl<QStringView>(QJsonObject *this,QStringView key)

{
  qsizetype index;
  long in_FS_OFFSET;
  bool keyExists;
  bool local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->o).d.ptr != (QCborContainerPrivate *)0x0) {
    local_19 = true;
    index = indexOf<QStringView>(&this->o,key,&local_19);
    if (local_19 == true) {
      removeAt(this,index);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QJsonObject::removeImpl(T key)
{
    if (!o)
        return;

    bool keyExists;
    auto index = indexOf(o, key, &keyExists);
    if (!keyExists)
        return;

    removeAt(index);
}